

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkTryNewMiter(char *pFileName0,char *pFileName1)

{
  Abc_Ntk_t *p;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *Entry;
  int local_84;
  int status;
  int Lit;
  Gia_Man_t *pGia;
  Abc_Ntk_t *pMiter;
  Abc_Ntk_t *pNtk2_;
  Abc_Ntk_t *pNtk1_;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Vec_Ptr_t *vCexes;
  Cnf_Dat_t *pCnf;
  sat_solver *pSat;
  int local_30;
  int nBTLimit;
  int iCoVarBeg;
  int iCiVarBeg;
  int *pVars;
  int nVars;
  int i;
  char *pFileName1_local;
  char *pFileName0_local;
  
  local_30 = 1;
  pSat._4_4_ = 100000;
  pCnf = (Cnf_Dat_t *)0x0;
  vCexes = (Vec_Ptr_t *)0x0;
  pNtk1 = (Abc_Ntk_t *)0x0;
  _nVars = pFileName1;
  pFileName1_local = pFileName0;
  pNtk2 = Io_Read(pFileName0,IO_FILE_VERILOG,1,0);
  pNtk1_ = Io_Read(_nVars,IO_FILE_VERILOG,1,0);
  pNtk2_ = Abc_NtkStrash(pNtk2,1,1,0);
  pMiter = Abc_NtkStrash(pNtk1_,1,1,0);
  pGia = (Gia_Man_t *)Abc_NtkMiter(pNtk2_,pMiter,1,0,0,1);
  _status = Abc_NtkClpGia((Abc_Ntk_t *)pGia);
  iVar2 = Abc_NtkCiNum(pNtk2);
  iVar3 = Abc_NtkCiNum(pNtk1_);
  if (iVar2 != iVar3) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c1,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  iVar2 = Abc_NtkCoNum(pNtk2);
  iVar3 = Abc_NtkCoNum(pNtk1_);
  if (iVar2 != iVar3) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c2,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  Abc_NtkDelete(pNtk2);
  Abc_NtkDelete(pNtk1_);
  Abc_NtkDelete(pNtk2_);
  Abc_NtkDelete(pMiter);
  Abc_NtkDelete((Abc_Ntk_t *)pGia);
  iVar2 = Gia_ManPoNum(_status);
  pNtk1 = (Abc_Ntk_t *)Vec_PtrStart(iVar2);
  vCexes = (Vec_Ptr_t *)Mf_ManGenerateCnf(_status,8,0,0,0,0);
  pVars._0_4_ = Gia_ManPiNum(_status);
  nBTLimit = *(int *)&vCexes->pArray - (int)pVars;
  _iCoVarBeg = (int *)malloc((long)(int)pVars << 2);
  for (pVars._4_4_ = 0; (int)pVars._4_4_ < (int)pVars; pVars._4_4_ = pVars._4_4_ + 1) {
    _iCoVarBeg[(int)pVars._4_4_] = nBTLimit + pVars._4_4_;
  }
  pCnf = (Cnf_Dat_t *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)vCexes,1,0);
  Cnf_DataFree((Cnf_Dat_t *)vCexes);
  pVars._4_4_ = 0;
  while( true ) {
    uVar1 = pVars._4_4_;
    iVar2 = Gia_ManPoNum(_status);
    if (iVar2 <= (int)uVar1) {
      Gia_ManStop(_status);
      sat_solver_delete((sat_solver *)pCnf);
      if (_iCoVarBeg != (int *)0x0) {
        free(_iCoVarBeg);
      }
      return (Vec_Ptr_t *)pNtk1;
    }
    local_84 = Abc_Var2Lit(local_30 + pVars._4_4_,0);
    iVar2 = sat_solver_solve((sat_solver *)pCnf,&local_84,&status,(long)pSat._4_4_,0,0,0);
    uVar1 = pVars._4_4_;
    p = pNtk1;
    if (iVar2 == 0) break;
    if (iVar2 != -1) {
      Entry = Sat_SolverGetModel((sat_solver *)pCnf,_iCoVarBeg,(int)pVars);
      Vec_PtrWriteEntry((Vec_Ptr_t *)p,uVar1,Entry);
      uVar1 = pVars._4_4_;
      uVar4 = Gia_ManPoNum(_status);
      printf("Output %3d (out of %3d) is SAT.\n",(ulong)uVar1,(ulong)uVar4);
    }
    pVars._4_4_ = pVars._4_4_ + 1;
  }
  __assert_fail("status != l_Undef",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                ,0x4d5,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkTryNewMiter( char * pFileName0, char * pFileName1 )
{
    extern void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit );
    int i, nVars, * pVars, iCiVarBeg, iCoVarBeg = 1, nBTLimit = 100000;
    sat_solver * pSat  = NULL;
    Cnf_Dat_t * pCnf   = NULL;
    Vec_Ptr_t * vCexes = NULL;
    Abc_Ntk_t * pNtk1  = Io_Read( pFileName0, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk2  = Io_Read( pFileName1, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk1_ = Abc_NtkStrash( pNtk1, 1, 1, 0 );
    Abc_Ntk_t * pNtk2_ = Abc_NtkStrash( pNtk2, 1, 1, 0 );
    Abc_Ntk_t * pMiter = Abc_NtkMiter( pNtk1_, pNtk2_, 1, 0, 0, 1 );
    Gia_Man_t * pGia = Abc_NtkClpGia( pMiter );
    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    Abc_NtkDelete( pNtk1 );
    Abc_NtkDelete( pNtk2 );
    Abc_NtkDelete( pNtk1_ );
    Abc_NtkDelete( pNtk2_ );
    Abc_NtkDelete( pMiter );
    vCexes = Vec_PtrStart( Gia_ManPoNum(pGia) );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 0, 0, 0 );
    nVars = Gia_ManPiNum(pGia);
    iCiVarBeg = pCnf->nVars - nVars;
    pVars = ABC_ALLOC( int, nVars );
    for ( i = 0; i < nVars; i++ )
        pVars[i] = iCiVarBeg + i;
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    Cnf_DataFree( pCnf );
    for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
    {
        int Lit = Abc_Var2Lit( iCoVarBeg + i, 0 );
        int status = sat_solver_solve( pSat, &Lit, &Lit + 1, nBTLimit, 0, 0, 0 );
        assert( status != l_Undef );
        if ( status == l_False )
            continue;
        Vec_PtrWriteEntry( vCexes, i, Sat_SolverGetModel(pSat, pVars, nVars) );
        printf( "Output %3d (out of %3d) is SAT.\n", i, Gia_ManPoNum(pGia) );
    }
    Gia_ManStop( pGia );
    sat_solver_delete( pSat );
    ABC_FREE( pVars );
    return vCexes;
}